

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

qulonglong __thiscall
QString::toIntegral_helper(QString *this,QStringView string,bool *ok,uint base)

{
  QString *__size;
  int base_00;
  size_t allocSize;
  long in_FS_OFFSET;
  QByteArrayView num;
  QSimpleParsedNumber<unsigned_long_long> QVar1;
  QVarLengthArray<unsigned_char,_256LL> latin1;
  QString *local_150;
  QLocaleData *local_148;
  uchar *local_140;
  uchar local_138 [256];
  long local_38;
  
  base_00 = (int)ok;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_150,0xaa,0x118);
  local_150 = (QString *)0x100;
  local_148 = (QLocaleData *)0x0;
  local_140 = local_138;
  if (0x100 < (long)this) {
    local_150 = this;
    __size = (QString *)QtPrivate::expectedAllocSize((size_t)this,0x10);
    if (__size == (QString *)0x0) {
      __size = this;
    }
    local_140 = (uchar *)malloc((size_t)__size);
    local_150 = __size;
    if (local_140 == (uchar *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        qBadAlloc();
      }
      goto LAB_00334d40;
    }
  }
  local_148 = (QLocaleData *)this;
  qt_to_latin1(local_140,(char16_t *)string.m_size,(qsizetype)this);
  num.m_data = (storage_type *)((ulong)ok & 0xffffffff);
  num.m_size = (qsizetype)local_140;
  QVar1 = QLocaleData::bytearrayToUnsLongLong(local_148,num,base_00);
  if (string.m_data != (storage_type_conflict *)0x0) {
    *(bool *)string.m_data = 0 < QVar1.used;
  }
  if (local_140 != local_138) {
    QtPrivate::sizedFree(local_140,(size_t)local_150);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar1.result;
  }
LAB_00334d40:
  __stack_chk_fail();
}

Assistant:

qulonglong QString::toIntegral_helper(QStringView string, bool *ok, uint base)
{
    return toIntegral<qulonglong>(string, ok, base);
}